

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.h
# Opt level: O3

rgba_vec_t * __thiscall
sfc::Subpalette::normalized_colors(rgba_vec_t *__return_storage_ptr__,Subpalette *this)

{
  Mode from_mode;
  rgba_t *prVar1;
  rgba_t rVar2;
  rgba_vec_t *__range1;
  rgba_t *color;
  rgba_t *prVar3;
  
  from_mode = this->_mode;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,&this->_colors);
  prVar1 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  for (prVar3 = (__return_storage_ptr__->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; prVar3 != prVar1; prVar3 = prVar3 + 1) {
    rVar2 = normalize_color(*prVar3,from_mode);
    *prVar3 = rVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

const rgba_vec_t normalized_colors() const { return normalize_colors(_colors, _mode); }